

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  int iVar1;
  byte *pbVar2;
  stbi_uc *psVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  int iVar12;
  stbi_uc sVar13;
  stbi_uc *psVar14;
  int iVar15;
  long lVar16;
  char *zout;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  byte local_a08 [31];
  byte abStack_9e9 [258];
  stbi_uc asStack_8e7 [211];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_001050ca:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_length;
    do {
      iVar6 = 0x112780;
      if (a->num_bits < 1) {
        stbi__fill_bits(a);
      }
      iVar9 = a->num_bits;
      uVar5 = a->code_buffer;
      a->code_buffer = uVar5 >> 1;
      a->num_bits = iVar9 + -1;
      if (iVar9 < 3) {
        stbi__fill_bits(a);
      }
      iVar9 = a->num_bits;
      uVar7 = a->code_buffer;
      a->code_buffer = uVar7 >> 2;
      uVar11 = iVar9 - 2;
      a->num_bits = uVar11;
      iVar15 = 0;
      switch(uVar7 & 3) {
      case 0:
        uVar11 = uVar11 & 7;
        if (uVar11 != 0) {
          stbi__zreceive(a,uVar11);
        }
        iVar6 = a->num_bits;
        if (iVar6 < 1) {
          uVar10 = 0;
        }
        else {
          uVar11 = a->code_buffer;
          uVar10 = 0;
          iVar9 = iVar6;
          do {
            *(char *)((long)local_814.fast + uVar10) = (char)uVar11;
            uVar10 = uVar10 + 1;
            uVar11 = uVar11 >> 8;
            iVar6 = iVar9 + -8;
            bVar4 = 8 < iVar9;
            iVar9 = iVar6;
          } while (bVar4);
          a->code_buffer = uVar11;
          a->num_bits = iVar6;
        }
        if (iVar6 != 0) {
          __assert_fail("a->num_bits == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/mobius3[P]chizu/src/stb_image.h"
                        ,0xfc1,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
        }
        if ((uint)uVar10 < 4) {
          psVar14 = a->zbuffer;
          psVar3 = a->zbuffer_end;
          uVar10 = uVar10 & 0xffffffff;
          do {
            if (psVar14 < psVar3) {
              a->zbuffer = psVar14 + 1;
              sVar13 = *psVar14;
              psVar14 = psVar14 + 1;
            }
            else {
              sVar13 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar10) = sVar13;
            uVar10 = uVar10 + 1;
          } while (uVar10 != 4);
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) == 0xffff) {
          uVar10 = (ulong)local_814.fast[0];
          if (a->zbuffer_end < a->zbuffer + uVar10) {
            stbi__g_failure_reason = "read past buffer";
          }
          else if ((a->zout + uVar10 <= a->zout_end) ||
                  (iVar6 = stbi__zexpand(a,a->zout,(uint)local_814.fast[0]), iVar6 != 0)) {
            memcpy(a->zout,a->zbuffer,uVar10);
            a->zbuffer = a->zbuffer + uVar10;
            a->zout = a->zout + uVar10;
            goto LAB_0010565c;
          }
        }
        else {
          stbi__g_failure_reason = "zlib corrupt";
        }
        goto LAB_001056a1;
      case 1:
        iVar9 = stbi__zbuild_huffman
                          (z,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                           ,0x120);
        if (iVar9 == 0) {
          return 0;
        }
        psVar14 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar15 = 0x20;
        break;
      case 2:
        if (iVar9 < 7) {
          stbi__fill_bits(a);
        }
        iVar6 = a->num_bits;
        uVar11 = a->code_buffer;
        a->code_buffer = uVar11 >> 5;
        a->num_bits = iVar6 + -5;
        if (iVar6 < 10) {
          stbi__fill_bits(a);
        }
        iVar6 = a->num_bits;
        uVar7 = a->code_buffer;
        a->code_buffer = uVar7 >> 5;
        a->num_bits = iVar6 + -5;
        if (iVar6 < 9) {
          stbi__fill_bits(a);
        }
        uVar11 = uVar11 & 0x1f;
        iVar9 = uVar11 + 0x101;
        iVar15 = (uVar7 & 0x1f) + 1;
        uVar7 = a->code_buffer;
        a->code_buffer = uVar7 >> 4;
        a->num_bits = a->num_bits + -4;
        local_a08[0] = 0;
        local_a08[1] = 0;
        local_a08[2] = 0;
        local_a08[3] = 0;
        local_a08[4] = 0;
        local_a08[5] = 0;
        local_a08[6] = 0;
        local_a08[7] = 0;
        local_a08[8] = 0;
        local_a08[9] = 0;
        local_a08[10] = 0;
        local_a08[0xb] = 0;
        local_a08[0xc] = 0;
        local_a08[0xd] = 0;
        local_a08[0xe] = 0;
        local_a08[0xf] = 0;
        local_a08[0x10] = 0;
        local_a08[0x11] = 0;
        local_a08[0x12] = 0;
        lVar16 = 0;
        do {
          if (a->num_bits < 3) {
            stbi__fill_bits(a);
          }
          uVar8 = a->code_buffer;
          a->code_buffer = uVar8 >> 3;
          a->num_bits = a->num_bits + -3;
          local_a08[(byte)(&stbi__compute_huffman_codes_length_dezigzag)[lVar16]] = (byte)uVar8 & 7;
          lVar16 = lVar16 + 1;
        } while ((ulong)(uVar7 & 0xf) + 4 != lVar16);
        iVar6 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar6 == 0) goto LAB_001056a1;
        iVar12 = iVar15 + iVar9;
        iVar6 = 0;
        while( true ) {
          if (iVar12 <= iVar6) break;
          uVar7 = stbi__zhuffman_decode(a,&local_814);
          if (uVar7 < 0x13) {
            if ((int)uVar7 < 0x10) {
              lVar16 = (long)iVar6;
              iVar6 = iVar6 + 1;
              abStack_9e9[lVar16 + 1] = (char)uVar7;
              bVar4 = true;
            }
            else {
              iVar1 = a->num_bits;
              if (uVar7 == 0x11) {
                if (iVar1 < 3) {
                  stbi__fill_bits(a);
                }
                uVar7 = a->code_buffer;
                a->code_buffer = uVar7 >> 3;
                a->num_bits = a->num_bits + -3;
                uVar7 = (uVar7 & 7) + 3;
LAB_0010538d:
                uVar8 = 0;
LAB_0010538f:
                if ((int)uVar7 <= iVar12 - iVar6) {
                  memset(abStack_9e9 + (long)iVar6 + 1,uVar8,(ulong)uVar7);
                  iVar6 = iVar6 + uVar7;
                  bVar4 = true;
                  goto LAB_001053dc;
                }
              }
              else {
                if (uVar7 != 0x10) {
                  if (iVar1 < 7) {
                    stbi__fill_bits(a);
                  }
                  uVar7 = a->code_buffer;
                  a->code_buffer = uVar7 >> 7;
                  a->num_bits = a->num_bits + -7;
                  uVar7 = (uVar7 & 0x7f) + 0xb;
                  goto LAB_0010538d;
                }
                if (iVar1 < 2) {
                  stbi__fill_bits(a);
                }
                uVar7 = a->code_buffer;
                a->code_buffer = uVar7 >> 2;
                a->num_bits = a->num_bits + -2;
                if (iVar6 != 0) {
                  uVar7 = (uVar7 & 3) + 3;
                  uVar8 = (uint)abStack_9e9[iVar6];
                  goto LAB_0010538f;
                }
                iVar6 = 0;
              }
              stbi__g_failure_reason = "bad codelengths";
              bVar4 = false;
            }
          }
          else {
            stbi__g_failure_reason = "bad codelengths";
            bVar4 = false;
          }
LAB_001053dc:
          if (!bVar4) goto LAB_001056a1;
        }
        if (iVar12 != iVar6) {
          stbi__g_failure_reason = "bad codelengths";
          goto LAB_001056a1;
        }
        iVar9 = stbi__zbuild_huffman(z,(stbi_uc *)((long)abStack_9e9 + 1),iVar9);
        if (iVar9 == 0) goto LAB_001056a1;
        psVar14 = asStack_8e7 + uVar11;
        break;
      case 3:
        goto switchD_00105143_caseD_3;
      }
      iVar9 = stbi__zbuild_huffman(&a->z_distance,psVar14,iVar15);
      if (iVar9 == 0) goto LAB_001056a1;
      zout = a->zout;
      do {
        iVar9 = stbi__zhuffman_decode(a,z);
        if (iVar9 < 0x100) {
          if (iVar9 < 0) {
LAB_0010551f:
            stbi__g_failure_reason = "bad huffman code";
            goto LAB_0010552d;
          }
          if (a->zout_end <= zout) {
            iVar15 = stbi__zexpand(a,zout,1);
            if (iVar15 == 0) goto LAB_0010552d;
            zout = a->zout;
          }
          *zout = (char)iVar9;
          zout = zout + 1;
          bVar4 = true;
        }
        else if (iVar9 == 0x100) {
          a->zout = zout;
          iVar6 = 1;
          bVar4 = false;
        }
        else {
          uVar10 = (ulong)(iVar9 - 0x101);
          uVar11 = stbi__zlength_base[uVar10];
          if (0xffffffffffffffeb < uVar10 - 0x1c) {
            uVar7 = stbi__zreceive(a,stbi__zlength_extra[uVar10]);
            uVar11 = uVar11 + uVar7;
          }
          uVar7 = stbi__zhuffman_decode(a,&a->z_distance);
          if ((int)uVar7 < 0) goto LAB_0010551f;
          uVar10 = (ulong)uVar7;
          iVar9 = stbi__zdist_base[uVar10];
          if (0xffffffffffffffe5 < uVar10 - 0x1e) {
            uVar7 = stbi__zreceive(a,stbi__zdist_extra[uVar10]);
            iVar9 = iVar9 + uVar7;
          }
          if ((long)zout - (long)a->zout_start < (long)iVar9) {
            stbi__g_failure_reason = "bad dist";
LAB_0010552d:
            bVar4 = false;
            iVar6 = 0;
          }
          else {
            if (a->zout_end < zout + (int)uVar11) {
              iVar15 = stbi__zexpand(a,zout,uVar11);
              if (iVar15 == 0) goto LAB_0010552d;
              zout = a->zout;
            }
            lVar16 = -(long)iVar9;
            if (iVar9 == 1) {
              bVar4 = true;
              if (uVar11 != 0) {
                memset(zout,(uint)(byte)zout[lVar16],(ulong)uVar11);
                zout = zout + (ulong)(uVar11 - 1) + 1;
              }
            }
            else {
              bVar4 = true;
              for (; uVar11 != 0; uVar11 = uVar11 - 1) {
                *zout = zout[lVar16];
                zout = zout + 1;
              }
            }
          }
        }
      } while (bVar4);
      if (iVar6 == 0) {
        return 0;
      }
LAB_0010565c:
    } while ((uVar5 & 1) == 0);
    iVar15 = 1;
  }
  else {
    pbVar2 = a->zbuffer;
    uVar11 = 0;
    uVar5 = 0;
    if (pbVar2 < a->zbuffer_end) {
      a->zbuffer = pbVar2 + 1;
      uVar5 = (uint)*pbVar2;
    }
    pbVar2 = a->zbuffer;
    if (pbVar2 < a->zbuffer_end) {
      a->zbuffer = pbVar2 + 1;
      uVar11 = (uint)*pbVar2;
    }
    if ((uVar5 << 8 | uVar11) * -0x42108421 < 0x8421085) {
      if ((uVar11 & 0x20) == 0) {
        if ((uVar5 & 0xf) == 8) goto LAB_001050ca;
        stbi__g_failure_reason = "bad compression";
      }
      else {
        stbi__g_failure_reason = "no preset dict";
      }
    }
    else {
      stbi__g_failure_reason = "bad zlib header";
    }
LAB_001056a1:
    iVar15 = 0;
  }
switchD_00105143_caseD_3:
  return iVar15;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}